

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O1

void __thiscall TimidityPPMIDIDevice::TimidityPPMIDIDevice(TimidityPPMIDIDevice *this,char *args)

{
  undefined8 in_RAX;
  undefined4 uVar1;
  
  uVar1 = (undefined4)((ulong)in_RAX >> 0x20);
  PseudoMIDIDevice::PseudoMIDIDevice(&this->super_PseudoMIDIDevice);
  (this->super_PseudoMIDIDevice).super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__TimidityPPMIDIDevice_006f4a20;
  FTempFileName::FTempFileName(&this->DiskName,"zmid");
  this->ChildProcess = -1;
  (this->CommandLine).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  this->WavePipe[0] = -1;
  this->WavePipe[1] = -1;
  if ((args == (char *)0x0) || (*args == '\0')) {
    args = timidity_exe.Value;
  }
  FString::Format(&this->CommandLine,"%s %s -EFchorus=%s -EFreverb=%s -s%d ",args,
                  timidity_extargs.Value,timidity_chorus.Value,timidity_reverb.Value,
                  CONCAT44(uVar1,timidity_frequency.Value));
  if ((this->DiskName).Name == (char *)0x0) {
    Printf(200,"Could not create temp music file\n");
  }
  return;
}

Assistant:

TimidityPPMIDIDevice::TimidityPPMIDIDevice(const char *args)
	: DiskName("zmid"),
#ifdef _WIN32
	  ReadWavePipe(INVALID_HANDLE_VALUE), WriteWavePipe(INVALID_HANDLE_VALUE),
	  ChildProcess(INVALID_HANDLE_VALUE),
	  Validated(false)
#else
	  ChildProcess(-1)
#endif
{
#ifndef _WIN32
	WavePipe[0] = WavePipe[1] = -1;
#endif

	if (args == NULL || *args == 0) args = timidity_exe;

	CommandLine.Format("%s %s -EFchorus=%s -EFreverb=%s -s%d ",
		args, *timidity_extargs,
		*timidity_chorus, *timidity_reverb, *timidity_frequency);

	if (DiskName == NULL)
	{
		Printf(PRINT_BOLD, "Could not create temp music file\n");
		return;
	}
}